

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_saveg.cpp
# Opt level: O1

FSerializer * Serialize(FSerializer *arc,char *key,sector_t_conflict *p,sector_t_conflict *def)

{
  int iVar1;
  TVector2<double> *pTVar2;
  bool bVar3;
  FSerializer *pFVar4;
  secplane_t *psVar5;
  secplane_t *psVar6;
  double local_58;
  double dStack_50;
  double local_48;
  double dStack_40;
  
  local_58 = 0.0;
  dStack_50 = 0.0;
  local_48 = 0.0;
  dStack_40 = 0.0;
  if ((arc->w != (FWriter *)0x0) && (level.Scrolls.Count != 0)) {
    dStack_50 = level.Scrolls.Array[p->sectornum].Y;
    local_58 = level.Scrolls.Array[p->sectornum].X;
  }
  bVar3 = FSerializer::BeginObject(arc,key);
  if (bVar3) {
    psVar6 = (secplane_t *)0x0;
    psVar5 = &def->floorplane;
    if (save_full != false) {
      psVar5 = psVar6;
    }
    Serialize(arc,"floorplane",&p->floorplane,psVar5);
    psVar5 = &def->ceilingplane;
    if (save_full != false) {
      psVar5 = psVar6;
    }
    Serialize(arc,"ceilingplane",&p->ceilingplane,psVar5);
    psVar5 = (secplane_t *)&def->lightlevel;
    if (save_full != false) {
      psVar5 = psVar6;
    }
    pFVar4 = Serialize(arc,"lightlevel",&p->lightlevel,(int16_t *)psVar5);
    psVar5 = (secplane_t *)&def->special;
    if (save_full != false) {
      psVar5 = psVar6;
    }
    pFVar4 = Serialize(pFVar4,"special",&p->special,(int16_t *)psVar5);
    psVar5 = (secplane_t *)&def->seqType;
    if (save_full != false) {
      psVar5 = psVar6;
    }
    pFVar4 = Serialize(pFVar4,"seqtype",&p->seqType,(int16_t *)psVar5);
    psVar5 = (secplane_t *)&def->SeqName;
    if (save_full != false) {
      psVar5 = psVar6;
    }
    pFVar4 = Serialize(pFVar4,"seqname",&(p->SeqName).super_FName,(FName *)psVar5);
    psVar5 = (secplane_t *)&def->friction;
    if (save_full != false) {
      psVar5 = psVar6;
    }
    pFVar4 = Serialize(pFVar4,"friction",&p->friction,(double *)psVar5);
    psVar5 = (secplane_t *)&def->movefactor;
    if (save_full != false) {
      psVar5 = psVar6;
    }
    pFVar4 = Serialize(pFVar4,"movefactor",&p->movefactor,(double *)psVar5);
    psVar5 = (secplane_t *)&def->stairlock;
    if (save_full != false) {
      psVar5 = psVar6;
    }
    pFVar4 = Serialize(pFVar4,"stairlock",&p->stairlock,(int8_t *)psVar5);
    psVar5 = (secplane_t *)&def->prevsec;
    if (save_full != false) {
      psVar5 = psVar6;
    }
    pFVar4 = Serialize(pFVar4,"prevsec",&p->prevsec,(int32_t *)psVar5);
    psVar5 = (secplane_t *)&def->nextsec;
    if (save_full != false) {
      psVar5 = psVar6;
    }
    pFVar4 = Serialize(pFVar4,"nextsec",&p->nextsec,(int32_t *)psVar5);
    pFVar4 = FSerializer::Array<sector_t::splane>(pFVar4,"planes",p->planes,def->planes,2,true);
    psVar5 = (secplane_t *)&def->damageamount;
    if (save_full != false) {
      psVar5 = psVar6;
    }
    pFVar4 = Serialize(pFVar4,"damageamount",&p->damageamount,(int32_t *)psVar5);
    psVar5 = (secplane_t *)&def->damageinterval;
    if (save_full != false) {
      psVar5 = psVar6;
    }
    pFVar4 = Serialize(pFVar4,"damageinterval",&p->damageinterval,(int16_t *)psVar5);
    psVar5 = (secplane_t *)&def->leakydamage;
    if (save_full != false) {
      psVar5 = psVar6;
    }
    pFVar4 = Serialize(pFVar4,"leakydamage",&p->leakydamage,(int16_t *)psVar5);
    psVar5 = (secplane_t *)&def->damagetype;
    if (save_full != false) {
      psVar5 = psVar6;
    }
    pFVar4 = Serialize(pFVar4,"damagetype",&(p->damagetype).super_FName,(FName *)psVar5);
    psVar5 = (secplane_t *)&def->sky;
    if (save_full != false) {
      psVar5 = psVar6;
    }
    pFVar4 = Serialize(pFVar4,"sky",&p->sky,(int32_t *)psVar5);
    psVar5 = (secplane_t *)&def->MoreFlags;
    if (save_full != false) {
      psVar5 = psVar6;
    }
    pFVar4 = Serialize(pFVar4,"moreflags",&p->MoreFlags,(uint16_t *)psVar5);
    psVar5 = (secplane_t *)&def->Flags;
    if (save_full != false) {
      psVar5 = psVar6;
    }
    pFVar4 = Serialize(pFVar4,"flags",&p->Flags,(uint32_t *)psVar5);
    pFVar4 = FSerializer::Array<unsigned_int>(pFVar4,"portals",p->Portals,def->Portals,2,true);
    psVar5 = (secplane_t *)&def->ZoneNumber;
    if (save_full != false) {
      psVar5 = psVar6;
    }
    pFVar4 = Serialize(pFVar4,"zonenumber",&p->ZoneNumber,(uint16_t *)psVar5);
    pFVar4 = FSerializer::Array<TObjPtr<DInterpolation>>
                       (pFVar4,"interpolations",p->interpolations,4,true);
    Serialize(pFVar4,"soundtarget",(DObject **)&p->SoundTarget,(DObject **)0x0,(bool *)0x0);
    Serialize(pFVar4,"secacttarget",(DObject **)&p->SecActTarget,(DObject **)0x0,(bool *)0x0);
    Serialize(pFVar4,"floordata",(DObject **)&p->floordata,(DObject **)0x0,(bool *)0x0);
    Serialize(pFVar4,"ceilingdata",(DObject **)&p->ceilingdata,(DObject **)0x0,(bool *)0x0);
    Serialize(pFVar4,"lightingdata",(DObject **)&p->lightingdata,(DObject **)0x0,(bool *)0x0);
    pFVar4 = Serialize<sector_t*,sector_t*>
                       (pFVar4,"fakefloor_sectors",(TArray<sector_t_*,_sector_t_*> *)p->e,
                        (TArray<sector_t_*,_sector_t_*> *)0x0);
    pFVar4 = Serialize<line_t*,line_t*>
                       (pFVar4,"midtexf_lines",&(p->e->Midtex).Floor.AttachedLines,
                        (TArray<line_t_*,_line_t_*> *)0x0);
    pFVar4 = Serialize<sector_t*,sector_t*>
                       (pFVar4,"midtexf_sectors",(TArray<sector_t_*,_sector_t_*> *)&p->e->Midtex,
                        (TArray<sector_t_*,_sector_t_*> *)0x0);
    pFVar4 = Serialize<line_t*,line_t*>
                       (pFVar4,"midtexc_lines",&(p->e->Midtex).Ceiling.AttachedLines,
                        (TArray<line_t_*,_line_t_*> *)0x0);
    pFVar4 = Serialize<sector_t*,sector_t*>
                       (pFVar4,"midtexc_sectors",&(p->e->Midtex).Ceiling.AttachedSectors,
                        (TArray<sector_t_*,_sector_t_*> *)0x0);
    pFVar4 = Serialize<FLinkedSector,FLinkedSector>
                       (pFVar4,"linked_floor",(TArray<FLinkedSector,_FLinkedSector> *)&p->e->Linked,
                        (TArray<FLinkedSector,_FLinkedSector> *)0x0);
    pFVar4 = Serialize<FLinkedSector,FLinkedSector>
                       (pFVar4,"linked_ceiling",&(p->e->Linked).Ceiling.Sectors,
                        (TArray<FLinkedSector,_FLinkedSector> *)0x0);
    psVar5 = (secplane_t *)&def->ColorMap;
    if (save_full != false) {
      psVar5 = psVar6;
    }
    pFVar4 = Serialize<FDynamicColormap>(pFVar4,"colormap",&p->ColorMap,(FDynamicColormap **)psVar5)
    ;
    pFVar4 = FSerializer::Terrain(pFVar4,"floorterrain",p->terrainnum,def->terrainnum);
    pFVar4 = FSerializer::Terrain(pFVar4,"ceilingterrain",p->terrainnum + 1,def->terrainnum + 1);
    psVar5 = (secplane_t *)&local_48;
    if (save_full != false) {
      psVar5 = psVar6;
    }
    pFVar4 = FSerializer::Array<double>(pFVar4,"scrolls",&local_58,(double *)psVar5,2,true);
    FSerializer::EndObject(pFVar4);
    if (((arc->r != (FReader *)0x0) && (dStack_50 != 0.0 || local_58 != 0.0)) &&
       (level.Scrolls.Count == 0)) {
      TArray<TVector2<double>,_TVector2<double>_>::Resize(&level.Scrolls,numsectors);
      memset(level.Scrolls.Array,0,(ulong)level.Scrolls.Count << 4);
      pTVar2 = level.Scrolls.Array;
      iVar1 = p->sectornum;
      level.Scrolls.Array[iVar1].Y = dStack_50;
      pTVar2[iVar1].X = local_58;
    }
  }
  return arc;
}

Assistant:

FSerializer &Serialize(FSerializer &arc, const char *key, sector_t &p, sector_t *def)
{
	// save the Scroll data here because it's a lot easier to handle a default.
	// Just writing out the full array can massively inflate the archive for no gain.
	DVector2 scroll = { 0,0 }, nul = { 0,0 };
	if (arc.isWriting() && level.Scrolls.Size() > 0) scroll = level.Scrolls[p.sectornum];

	if (arc.BeginObject(key))
	{
		arc("floorplane", p.floorplane, def->floorplane)
			("ceilingplane", p.ceilingplane, def->ceilingplane)
			("lightlevel", p.lightlevel, def->lightlevel)
			("special", p.special, def->special)
			("seqtype", p.seqType, def->seqType)
			("seqname", p.SeqName, def->SeqName)
			("friction", p.friction, def->friction)
			("movefactor", p.movefactor, def->movefactor)
			("stairlock", p.stairlock, def->stairlock)
			("prevsec", p.prevsec, def->prevsec)
			("nextsec", p.nextsec, def->nextsec)
			.Array("planes", p.planes, def->planes, 2, true)
			// These cannot change during play.
			//("heightsec", p.heightsec)
			//("bottommap", p.bottommap)
			//("midmap", p.midmap)
			//("topmap", p.topmap)
			("damageamount", p.damageamount, def->damageamount)
			("damageinterval", p.damageinterval, def->damageinterval)
			("leakydamage", p.leakydamage, def->leakydamage)
			("damagetype", p.damagetype, def->damagetype)
			("sky", p.sky, def->sky)
			("moreflags", p.MoreFlags, def->MoreFlags)
			("flags", p.Flags, def->Flags)
			.Array("portals", p.Portals, def->Portals, 2, true)
			("zonenumber", p.ZoneNumber, def->ZoneNumber)
			.Array("interpolations", p.interpolations, 4, true)
			("soundtarget", p.SoundTarget)
			("secacttarget", p.SecActTarget)
			("floordata", p.floordata)
			("ceilingdata", p.ceilingdata)
			("lightingdata", p.lightingdata)
			("fakefloor_sectors", p.e->FakeFloor.Sectors)
			("midtexf_lines", p.e->Midtex.Floor.AttachedLines)
			("midtexf_sectors", p.e->Midtex.Floor.AttachedSectors)
			("midtexc_lines", p.e->Midtex.Ceiling.AttachedLines)
			("midtexc_sectors", p.e->Midtex.Ceiling.AttachedSectors)
			("linked_floor", p.e->Linked.Floor.Sectors)
			("linked_ceiling", p.e->Linked.Ceiling.Sectors)
			("colormap", p.ColorMap, def->ColorMap)
			.Terrain("floorterrain", p.terrainnum[0], &def->terrainnum[0])
			.Terrain("ceilingterrain", p.terrainnum[1], &def->terrainnum[1])
			("scrolls", scroll, nul)
			.EndObject();

		if (arc.isReading() && !scroll.isZero())
		{
			if (level.Scrolls.Size() == 0)
			{
				level.Scrolls.Resize(numsectors);
				memset(&level.Scrolls[0], 0, sizeof(level.Scrolls[0])*level.Scrolls.Size());
				level.Scrolls[p.sectornum] = scroll;
			}
		}
	}
	return arc;
}